

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.h
# Opt level: O2

void __thiscall QSharedMemory::setNativeKey(QSharedMemory *this,QString *key,Type type)

{
  long in_FS_OFFSET;
  QNativeIpcKey local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QNativeIpcKey::QNativeIpcKey(&local_40,key,type);
  setNativeKey(this,&local_40);
  QNativeIpcKey::~QNativeIpcKey(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setNativeKey(const QString &key, QNativeIpcKey::Type type = QNativeIpcKey::legacyDefaultTypeForOs())
    { setNativeKey({ key, type }); }